

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O2

Image * __thiscall VideoEngine::makeScreenshot(Image *__return_storage_ptr__,VideoEngine *this)

{
  Canvas *pCVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator_type local_3a;
  value_type_conflict3 local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  pCVar1 = (this->canvas_)._M_t.
           super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>.
           _M_t.
           super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
           super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl;
  local_39 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             (long)((pCVar1->fb_).w * (pCVar1->fb_).h * 3),&local_39,&local_3a);
  pCVar1 = (this->canvas_)._M_t.
           super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>.
           _M_t.
           super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
           super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl;
  glReadPixels(0,0,(pCVar1->fb_).w,(pCVar1->fb_).h,0x1907,0x1401,
               local_38._M_impl.super__Vector_impl_data._M_start);
  pCVar1 = (this->canvas_)._M_t.
           super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>.
           _M_t.
           super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
           super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl;
  iVar2 = (pCVar1->fb_).h;
  __return_storage_ptr__->w = (pCVar1->fb_).w;
  __return_storage_ptr__->h = iVar2;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Image VideoEngine::makeScreenshot() const {
	std::vector<unsigned char> data((size_t)(canvas_->width() * canvas_->height() * 3), 0);
	glReadPixels(0, 0, canvas_->width(), canvas_->height(), GL_RGB, GL_UNSIGNED_BYTE, data.data());
	return Image{canvas_->width(), canvas_->height(), std::move(data)};
}